

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::LoadLocal(VirtualMachine *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pVVar2;
  size_t sVar3;
  Variable v;
  string local_40;
  
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"No stack frame found in LoadLocal","");
    panic(this,&local_40);
  }
  this_00 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  sVar3 = getByteCodeParameter(this);
  pVVar2 = (peVar1->locals).
           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar3 < (ulong)((long)(peVar1->locals).
                            super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4)) {
    v._4_4_ = 0;
    v.type = pVVar2[sVar3].type;
    v.field_1.integerValue =
         ((anon_union_8_6_52c89740_for_Variable_1 *)((long)(pVVar2 + sVar3) + 8))->integerValue;
    pushOpStack(this,v);
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Index out of bounds in LoadLocal","");
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::LoadLocal() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in LoadLocal");
    return;
  }

  auto stackFrame = this->stackFrame;

  auto locals = &stackFrame->locals;

  auto index = this->getByteCodeParameter();

  if (index >= locals->size()) {
    this->panic("Index out of bounds in LoadLocal");
    return;
  }

  Variable local = locals->at(index);

  this->pushOpStack(local);

  this->advance();
}